

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration_proxy.hpp
# Opt level: O2

void nlohmann::detail::int_to_string<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target,
               size_t value)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,value);
  std::__cxx11::string::operator=((string *)target,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void int_to_string( string_type& target, std::size_t value )
{
    target = std::to_string(value);
}